

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br_00;
  uint32_t **decoded_data_00;
  ushort uVar1;
  ushort uVar2;
  HuffmanCode HVar3;
  uint32_t *puVar4;
  bool bVar5;
  uint32_t uVar6;
  VP8LImageTransformType VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint32_t *puVar11;
  ulong uVar12;
  int *code_lengths;
  HuffmanCode *ptr;
  HTreeGroup *pHVar13;
  void *__s;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  HuffmanCode *pHVar19;
  int iVar20;
  uint64_t nmemb;
  uint uVar21;
  VP8LTransform *pVVar22;
  uint uVar23;
  VP8LBitReader *br;
  ulong uVar24;
  HTreeGroup *local_b8;
  VP8StatusCode local_ac;
  ulong local_a8;
  uint32_t *local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  long local_70;
  HuffmanCode *local_68;
  ulong local_60;
  VP8LMetadata *local_58;
  HuffmanCode *local_50;
  uint32_t *local_48;
  ulong local_40;
  uint32_t **local_38;
  
  uVar16 = (ulong)(uint)xsize;
  br_00 = &dec->br_;
  local_58 = &dec->hdr_;
  local_ac = VP8_STATUS_BITSTREAM_ERROR;
  local_38 = decoded_data;
  if (is_level0 == 0) {
    iVar8 = 0;
LAB_001081e9:
    uVar6 = VP8LReadBits(br_00,1);
    if (uVar6 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = VP8LReadBits(br_00,4);
      if (10 < uVar17 - 1) goto LAB_0010884d;
    }
    local_88 = (uint32_t *)0x0;
    uVar1 = kTableSize[uVar17];
    if (iVar8 == 0) {
      __s = (void *)0x0;
      local_a8 = 1;
      uVar12 = 1;
LAB_00108312:
      bVar5 = true;
      code_lengths = (int *)0x0;
      if ((dec->br_).eos_ == 0) {
        local_7c = 1 << ((byte)uVar17 & 0x1f);
        nmemb = 0;
        for (lVar15 = 0; lVar15 != 10; lVar15 = lVar15 + 2) {
          iVar8 = 0;
          if (lVar15 == 0) {
            iVar8 = local_7c;
          }
          if ((int)uVar17 < 1) {
            iVar8 = 0;
          }
          uVar21 = iVar8 + (uint)*(ushort *)((long)kAlphabetSize + lVar15);
          if ((int)nmemb <= (int)uVar21) {
            nmemb = (uint64_t)uVar21;
          }
        }
        code_lengths = (int *)WebPSafeCalloc(nmemb,4);
        local_40 = uVar12;
        ptr = (HuffmanCode *)WebPSafeMalloc((ulong)uVar1 * (long)(int)uVar12,4);
        local_b8 = VP8LHtreeGroupsNew((int)uVar12);
        if (((local_b8 == (HTreeGroup *)0x0) || (code_lengths == (int *)0x0)) ||
           (ptr == (HuffmanCode *)0x0)) {
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_001087e3;
        }
        if ((int)local_a8 == 0) {
          local_a8 = 0;
        }
        local_48 = &local_b8->packed_table[0].value;
        uVar12 = 0;
        local_68 = ptr;
        local_60 = uVar16;
        local_50 = ptr;
        while (uVar12 != local_a8) {
          local_78 = uVar12;
          if (__s == (void *)0x0) {
            iVar8 = (int)uVar12;
LAB_0010847e:
            local_70 = (long)iVar8 * 0x238;
            pHVar13 = local_b8 + iVar8;
            iVar8 = 0;
            uVar21 = 1;
            local_80 = 0;
            pHVar19 = local_50;
            for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
              iVar9 = 0;
              if (uVar16 == 0) {
                iVar9 = local_7c;
              }
              uVar1 = kAlphabetSize[uVar16];
              pHVar13->htrees[uVar16] = pHVar19;
              if ((int)uVar17 < 1) {
                iVar9 = 0;
              }
              iVar10 = ReadHuffmanCode(iVar9 + (uint)uVar1,dec,code_lengths,pHVar19);
              if (iVar10 == 0) {
                bVar5 = true;
                uVar16 = local_60;
                ptr = local_68;
                goto LAB_00108820;
              }
              if (uVar21 == 0) {
                bVar14 = pHVar19->bits;
                uVar21 = 0;
              }
              else {
                bVar14 = pHVar19->bits;
                if ((uVar16 & 3) == 0) {
                  uVar21 = 1;
                }
                else {
                  uVar21 = (uint)(bVar14 == 0);
                }
              }
              if (uVar16 != 4) {
                iVar20 = *code_lengths;
                for (uVar12 = 1; uVar12 < iVar9 + (uint)uVar1; uVar12 = uVar12 + 1) {
                  if (iVar20 < code_lengths[uVar12]) {
                    iVar20 = code_lengths[uVar12];
                  }
                }
                local_80 = local_80 + iVar20;
              }
              iVar8 = iVar8 + (uint)bVar14;
              pHVar19 = pHVar19 + iVar10;
            }
            pHVar13->is_trivial_literal = uVar21;
            pHVar13->is_trivial_code = 0;
            bVar14 = 1;
            if (uVar21 != 0) {
              uVar21 = CONCAT22(pHVar13->htrees[1]->value,pHVar13->htrees[2]->value) |
                       (uint)pHVar13->htrees[3]->value << 0x18;
              pHVar13->literal_arb = uVar21;
              if ((iVar8 == 0) && (uVar1 = pHVar13->htrees[0]->value, uVar1 < 0x100)) {
                pHVar13->is_trivial_code = 1;
                pHVar13->literal_arb = uVar21 | (uint)uVar1 << 8;
                bVar14 = 0;
              }
            }
            bVar14 = local_80 < 6 & bVar14;
            pHVar13->use_packed_table = (uint)bVar14;
            uVar16 = local_60;
            ptr = local_68;
            local_50 = pHVar19;
            if (bVar14 == 1) {
              pHVar19 = pHVar13->htrees[0];
              local_70 = local_70 + (long)local_48;
              for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 1) {
                bVar14 = pHVar19[lVar15].bits;
                uVar1 = pHVar19[lVar15].value;
                if (uVar1 < 0x100) {
                  *(uint *)(local_70 + -4 + lVar15 * 8) = (uint)bVar14;
                  uVar21 = (uint)lVar15 >> (bVar14 & 0x1f);
                  *(uint *)(local_70 + lVar15 * 8) = (uint)uVar1 << 8;
                  HVar3 = pHVar13->htrees[1][uVar21];
                  iVar8 = ((uint)HVar3 & 0xff) + (uint)bVar14;
                  *(int *)(local_70 + -4 + lVar15 * 8) = iVar8;
                  uVar23 = (uint)HVar3 & 0xffff0000 | (uint)uVar1 << 8;
                  *(uint *)(local_70 + lVar15 * 8) = uVar23;
                  uVar21 = uVar21 >> (HVar3.bits & 0x1f);
                  HVar3 = pHVar13->htrees[2][uVar21];
                  iVar8 = ((uint)HVar3 & 0xff) + iVar8;
                  *(int *)(local_70 + -4 + lVar15 * 8) = iVar8;
                  uVar23 = (uint)HVar3 >> 0x10 | uVar23;
                  *(uint *)(local_70 + lVar15 * 8) = uVar23;
                  HVar3 = pHVar13->htrees[3][uVar21 >> (HVar3.bits & 0x1f)];
                  *(uint *)(local_70 + -4 + lVar15 * 8) = ((uint)HVar3 & 0xff) + iVar8;
                  *(uint *)(local_70 + lVar15 * 8) = ((uint)HVar3 & 0xff0000) << 8 | uVar23;
                }
                else {
                  *(uint *)(local_70 + -4 + lVar15 * 8) = bVar14 | 0x100;
                  *(uint *)(local_70 + lVar15 * 8) = (uint)uVar1;
                }
              }
            }
          }
          else {
            iVar8 = *(int *)((long)__s + uVar12 * 4);
            if (iVar8 != -1) goto LAB_0010847e;
            lVar15 = 0;
            while (lVar15 != 10) {
              iVar8 = 0;
              if (lVar15 == 0) {
                iVar8 = local_7c;
              }
              if ((int)uVar17 < 1) {
                iVar8 = 0;
              }
              iVar8 = ReadHuffmanCode(iVar8 + (uint)*(ushort *)((long)kAlphabetSize + lVar15),dec,
                                      code_lengths,(HuffmanCode *)0x0);
              lVar15 = lVar15 + 2;
              if (iVar8 == 0) {
                bVar5 = true;
                goto LAB_00108820;
              }
            }
          }
          uVar12 = local_78 + 1;
        }
        (dec->hdr_).huffman_image_ = local_88;
        (dec->hdr_).num_htree_groups_ = (int)local_40;
        (dec->hdr_).htree_groups_ = local_b8;
        (dec->hdr_).huffman_tables_ = ptr;
        bVar5 = false;
      }
      else {
        local_b8 = (HTreeGroup *)0x0;
        ptr = (HuffmanCode *)0x0;
      }
    }
    else {
      uVar6 = VP8LReadBits(br_00,1);
      uVar12 = 1;
      if (uVar6 == 0) {
LAB_00108303:
        __s = (void *)0x0;
        local_a8 = uVar12;
        goto LAB_00108312;
      }
      uVar6 = VP8LReadBits(br_00,3);
      bVar14 = (byte)(uVar6 + 2);
      iVar8 = 1 << (bVar14 & 0x1f);
      uVar23 = (iVar8 + (int)uVar16) - 1U >> (bVar14 & 0x1f);
      uVar21 = (ysize + iVar8) - 1U >> (bVar14 & 0x1f);
      uVar12 = 0;
      iVar8 = DecodeImageStream(uVar23,uVar21,0,dec,&local_88);
      if (iVar8 != 0) {
        uVar23 = uVar23 * uVar21;
        (dec->hdr_).huffman_subsample_bits_ = uVar6 + 2;
        uVar24 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar24 = uVar12;
        }
        local_a8 = 1;
        for (; uVar21 = (uint)local_a8, uVar24 != uVar12; uVar12 = uVar12 + 1) {
          uVar2 = *(ushort *)((long)local_88 + uVar12 * 4 + 1);
          local_88[uVar12] = (uint)uVar2;
          if (uVar21 <= uVar2) {
            local_a8 = (ulong)(uVar2 + 1);
          }
        }
        if ((uVar21 < 0x3e9) && (uVar12 = local_a8, (int)uVar21 <= (int)uVar16 * ysize))
        goto LAB_00108303;
        __s = WebPSafeMalloc(local_a8,4);
        if (__s != (void *)0x0) {
          memset(__s,0xff,local_a8 << 2);
          uVar12 = 0;
          for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
            uVar6 = *(uint32_t *)((long)__s + (ulong)local_88[uVar18] * 4);
            if (uVar6 == 0xffffffff) {
              uVar6 = (uint32_t)uVar12;
              *(uint32_t *)((long)__s + (ulong)local_88[uVar18] * 4) = uVar6;
              uVar12 = (ulong)(uVar6 + 1);
            }
            local_88[uVar18] = uVar6;
          }
          goto LAB_00108312;
        }
        dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      }
      __s = (void *)0x0;
      code_lengths = (int *)0x0;
      ptr = (HuffmanCode *)0x0;
      local_b8 = (HTreeGroup *)0x0;
LAB_001087e3:
      bVar5 = true;
    }
LAB_00108820:
    WebPSafeFree(code_lengths);
    WebPSafeFree(__s);
    if (bVar5) {
      WebPSafeFree(local_88);
      WebPSafeFree(ptr);
      VP8LHtreeGroupsFree(local_b8);
      goto LAB_0010884d;
    }
    if ((int)uVar17 < 1) {
      local_58->color_cache_size_ = 0;
    }
    else {
      local_ac = VP8_STATUS_OUT_OF_MEMORY;
      (dec->hdr_).color_cache_size_ = 1 << ((byte)uVar17 & 0x1f);
      iVar8 = VP8LColorCacheInit(&(dec->hdr_).color_cache_,uVar17);
      if (iVar8 == 0) goto LAB_0010884d;
    }
    iVar8 = (dec->hdr_).huffman_subsample_bits_;
    iVar9 = 1;
    bVar14 = (byte)iVar8;
    iVar10 = (int)uVar16;
    dec->width_ = iVar10;
    dec->height_ = ysize;
    (dec->hdr_).huffman_xsize_ = ((1 << (bVar14 & 0x1f)) + iVar10) - 1U >> (bVar14 & 0x1f);
    (dec->hdr_).huffman_mask_ = -(uint)(iVar8 == 0) | ~(-1 << (bVar14 & 0x1f));
    if (is_level0 != 0) {
      dec->state_ = READ_HDR;
      puVar11 = (uint32_t *)0x0;
LAB_00108917:
      if (local_38 != (uint32_t **)0x0) {
        *local_38 = puVar11;
      }
      dec->last_pixel_ = 0;
      if (is_level0 != 0) {
        return 1;
      }
      goto LAB_00108866;
    }
    puVar11 = (uint32_t *)WebPSafeMalloc((long)ysize * (long)iVar10,4);
    if (puVar11 == (uint32_t *)0x0) {
      local_ac = VP8_STATUS_OUT_OF_MEMORY;
      goto LAB_0010884d;
    }
    iVar8 = DecodeImageData(dec,puVar11,iVar10,ysize,ysize,(ProcessRowsFunc)0x0);
    if ((iVar8 != 0) && ((dec->br_).eos_ == 0)) goto LAB_00108917;
  }
  else {
    do {
      while( true ) {
        uVar6 = VP8LReadBits(br_00,1);
        iVar8 = is_level0;
        if (uVar6 == 0) goto LAB_001081e9;
        iVar8 = dec->next_transform_;
        VVar7 = VP8LReadBits(br_00,2);
        if ((dec->transforms_seen_ >> (VVar7 & 0x1f) & 1) != 0) goto LAB_0010884d;
        pVVar22 = dec->transforms_ + iVar8;
        dec->transforms_seen_ = dec->transforms_seen_ | 1 << ((byte)VVar7 & 0x1f);
        pVVar22->type_ = VVar7;
        pVVar22->xsize_ = (int)uVar16;
        pVVar22->ysize_ = ysize;
        decoded_data_00 = &pVVar22->data_;
        pVVar22->data_ = (uint32_t *)0x0;
        dec->next_transform_ = dec->next_transform_ + 1;
        if (VVar7 < SUBTRACT_GREEN) break;
        if (VVar7 == COLOR_INDEXING_TRANSFORM) {
          uVar6 = VP8LReadBits(br_00,8);
          iVar8 = uVar6 + 1;
          uVar17 = 0;
          if ((iVar8 < 0x11) && (uVar17 = 1, iVar8 < 5)) {
            uVar17 = 2 < iVar8 ^ 3;
          }
          uVar16 = (ulong)((pVVar22->xsize_ + (1 << (sbyte)uVar17)) - 1U >> (sbyte)uVar17);
          pVVar22->bits_ = uVar17;
          iVar9 = DecodeImageStream(iVar8,1,0,dec,decoded_data_00);
          if (iVar9 == 0) goto LAB_0010884d;
          bVar14 = (byte)(8L >> ((byte)pVVar22->bits_ & 0x3f));
          puVar11 = (uint32_t *)WebPSafeMalloc(1L << (bVar14 & 0x3f),4);
          if (puVar11 == (uint32_t *)0x0) goto LAB_0010884d;
          puVar4 = *decoded_data_00;
          *puVar11 = *puVar4;
          for (uVar12 = 4; (long)uVar12 < (long)(iVar8 * 4); uVar12 = uVar12 + 1) {
            *(char *)((long)puVar11 + uVar12) =
                 *(char *)((long)puVar11 + (uVar12 - 4)) + *(char *)((long)puVar4 + uVar12);
          }
          for (; uVar12 < (uint)(4 << (bVar14 & 0x1f)); uVar12 = uVar12 + 1) {
            *(undefined1 *)((long)puVar11 + uVar12) = 0;
          }
          WebPSafeFree(*decoded_data_00);
          *decoded_data_00 = puVar11;
        }
      }
      uVar6 = VP8LReadBits(br_00,3);
      bVar14 = (byte)(uVar6 + 2);
      pVVar22->bits_ = uVar6 + 2;
      uVar17 = ~(-1 << (bVar14 & 0x1f));
      iVar8 = DecodeImageStream(pVVar22->xsize_ + uVar17 >> (bVar14 & 0x1f),
                                uVar17 + pVVar22->ysize_ >> (bVar14 & 0x1f),0,dec,decoded_data_00);
    } while (iVar8 != 0);
LAB_0010884d:
    dec->status_ = local_ac;
    puVar11 = (uint32_t *)0x0;
  }
  WebPSafeFree(puVar11);
  iVar9 = 0;
LAB_00108866:
  ClearMetadata(local_58);
  return iVar9;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size_ = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache_, color_cache_bits)) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  } else {
    hdr->color_cache_size_ = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state_ = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos_;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel_ = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}